

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O3

void ApprovalTests::FileUtils::ensureFileExists(string *fullFilePath)

{
  pointer pcVar1;
  int iVar2;
  stat info;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  stat local_a0;
  
  memset(&local_a0,0,0x90);
  iVar2 = stat((fullFilePath->_M_dataplus)._M_p,&local_a0);
  if (iVar2 != 0) {
    pcVar1 = (fullFilePath->_M_dataplus)._M_p;
    local_c0[0] = local_b0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar1,pcVar1 + fullFilePath->_M_string_length);
    if (EmptyFileCreatorFactory::currentCreator_abi_cxx11_._16_8_ == 0) {
      ::std::__throw_bad_function_call();
    }
    (*(code *)EmptyFileCreatorFactory::currentCreator_abi_cxx11_._24_8_)
              (EmptyFileCreatorFactory::currentCreator_abi_cxx11_,local_c0);
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0]);
    }
  }
  return;
}

Assistant:

void FileUtils::ensureFileExists(const std::string& fullFilePath)
    {
        if (!fileExists(fullFilePath))
        {
            EmptyFileCreatorFactory::currentCreator(fullFilePath);
        }
    }